

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O2

void __thiscall jrtplib::RTCPScheduler::PerformReverseReconsideration(RTCPScheduler *this)

{
  double dVar1;
  int iVar2;
  double dVar3;
  RTPTime RVar4;
  double dVar5;
  
  if (this->firstcall == false) {
    iVar2 = this->sources->activecount;
    RVar4 = RTPTime::CurrentTime();
    dVar3 = (this->nextrtcptime).m_t;
    dVar5 = (double)iVar2 / (double)(int)(this->pmembers + (uint)(this->pmembers == 0));
    dVar1 = (this->prevrtcptime).m_t;
    (this->nextrtcptime).m_t =
         RVar4.m_t + dVar5 * (double)(-(ulong)(RVar4.m_t < dVar3) & (ulong)(dVar3 - RVar4.m_t));
    (this->prevrtcptime).m_t =
         RVar4.m_t - dVar5 * (double)(-(ulong)(dVar1 < RVar4.m_t) & (ulong)(RVar4.m_t - dVar1));
    this->pmembers = iVar2;
  }
  return;
}

Assistant:

void RTCPScheduler::PerformReverseReconsideration()
{
	if (firstcall)
		return;
	
	double diff1,diff2;
	int members = sources.GetActiveMemberCount();
	
	RTPTime tc = RTPTime::CurrentTime();
	RTPTime tn_min_tc = nextrtcptime;

	if (tn_min_tc > tc)
		tn_min_tc -= tc;
	else
		tn_min_tc = RTPTime(0,0);

//	std::cout << "+tn_min_tc0 " << nextrtcptime.GetDouble()-tc.GetDouble() << std::endl;
//	std::cout << "-tn_min_tc0 " << -nextrtcptime.GetDouble()+tc.GetDouble() << std::endl;
//	std::cout << "tn_min_tc " << tn_min_tc.GetDouble() << std::endl;
	
	RTPTime tc_min_tp = tc;

	if (tc_min_tp > prevrtcptime)
		tc_min_tp -= prevrtcptime;
	else
		tc_min_tp = 0;
	
	if (pmembers == 0) // avoid division by zero
		pmembers++;
	
	diff1 = (((double)members)/((double)pmembers))*tn_min_tc.GetDouble();
	diff2 = (((double)members)/((double)pmembers))*tc_min_tp.GetDouble();

	nextrtcptime = tc;
	prevrtcptime = tc;
	nextrtcptime += RTPTime(diff1);
	prevrtcptime -= RTPTime(diff2);
	
	pmembers = members;
}